

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::addSatUI8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  int32_t iVar1;
  int32_t iVar2;
  byte bVar3;
  
  iVar1 = geti32(this);
  iVar2 = geti32(other);
  bVar3 = 0xff;
  if (!CARRY1((byte)iVar2,(byte)iVar1)) {
    bVar3 = (byte)iVar2 + (byte)iVar1;
  }
  *(uint *)&__return_storage_ptr__->field_0 = (uint)bVar3;
  (__return_storage_ptr__->type).id = 2;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::addSatUI8(const Literal& other) const {
  return Literal(add_sat_u<uint8_t>(geti32(), other.geti32()));
}